

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

_Bool cmdq_pop(cmd_context c)

{
  int iVar1;
  cmd_handler_fn p_Var2;
  player *ppVar3;
  _Bool _Var4;
  wchar_t wVar5;
  uint32_t uVar6;
  wchar_t wVar7;
  cmd_code code;
  
  ppVar3 = player;
  if (repeating == '\x01') {
    wVar7 = (cmd_tail + L'\x13') % 0x14;
    wVar5 = cmd_tail;
  }
  else {
    if (cmd_head == cmd_tail) {
      return false;
    }
    wVar7 = cmd_tail;
    wVar5 = L'\0';
    if (cmd_tail + L'\x01' != L'\x14') {
      wVar5 = cmd_tail + L'\x01';
    }
  }
  cmd_tail = wVar5;
  if (cmd_queue[wVar7].background_command == 0) {
    last_command_idx = (cmd_tail + L'\x13') % 0x14;
  }
  if (player->timed[0x2c] == 0) {
    code = cmd_queue[wVar7].code;
  }
  else {
    code = CMD_COMMAND_MONSTER;
  }
  iVar1 = cmd_queue[wVar7].nrepeats;
  wVar5 = cmd_idx(code);
  ppVar3->upkeep->command_wrk = L'\0';
  if (wVar5 != L'\xffffffff') {
    if (game_cmds[wVar5].repeat_allowed == true) {
      if ((L'\0' < game_cmds[wVar5].auto_repeat_n) && (iVar1 == 0)) {
        cmd_set_repeat(game_cmds[wVar5].auto_repeat_n);
      }
    }
    else {
      cmd_queue[wVar7].nrepeats = 0;
      repeating = '\0';
    }
    repeat_prev_allowed = 1;
    cmd_queue[wVar7].context = c;
    p_Var2 = game_cmds[wVar5].fn;
    if (p_Var2 != (cmd_handler_fn)0x0) {
      if (cmd_queue[wVar7].background_command < 2) {
        if ((game_cmds[wVar5].can_use_energy == true) && (player->skip_cmd_coercion == '\0')) {
          uVar6 = Rand_div(200);
          if ((int)uVar6 < (int)player->timed[0x31]) {
            _Var4 = player_attack_random_monster(player);
            if (_Var4) {
              return true;
            }
          }
          else if (player->timed[0x31] != 0) {
            player->skip_cmd_coercion = '\x01';
          }
        }
      }
      else if ((player->skip_cmd_coercion != '\0') && (game_cmds[wVar5].can_use_energy == true)) {
        player->skip_cmd_coercion = '\x02';
      }
      (*p_Var2)(cmd_queue + wVar7);
    }
    if ((0 < cmd_queue[wVar7].nrepeats) &&
       (iVar1 == cmd_queue[(cmd_tail + L'\x13') % 0x14].nrepeats)) {
      cmd_set_repeat(iVar1 + L'\xffffffff');
    }
  }
  return true;
}

Assistant:

bool cmdq_pop(cmd_context c)
{
	struct command *cmd;

	/* If we're repeating, just pull the last command again. */
	if (repeating) {
		cmd = &cmd_queue[prev_cmd_idx(cmd_tail)];
	} else if (cmd_head != cmd_tail) {
		/* If we have a command ready, set it. */
		cmd = &cmd_queue[cmd_tail++];
		if (cmd_tail == CMD_QUEUE_SIZE)
			cmd_tail = 0;
	} else {
		/* Failure to get a command. */
		return false;
	}

	/* Now process it */
	if (!cmd->background_command) {
		last_command_idx = prev_cmd_idx(cmd_tail);
	}
	process_command(c, cmd);
	return true;
}